

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkPrintDistribStat(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  uint uVar1;
  ulong uVar2;
  Cba_Ntk_t *p_00;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = (p->vObjType).nSize;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  uVar5 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)((int)uVar5 + (uint)('\x03' < (p->vObjType).pArray[uVar4]));
  }
  printf("Primitives (%d):\n",uVar5);
  for (lVar6 = 0; lVar6 != 0x5a; lVar6 = lVar6 + 1) {
    if (pCounts[lVar6] != 0) {
      printf("%-20s = %5d\n",p->pDesign->pTypeNames[lVar6]);
    }
  }
  uVar1 = (p->vObjType).nSize;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  uVar5 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)((int)uVar5 + (uint)((p->vObjType).pArray[uVar4] == '\x03'));
  }
  printf("User hierarchy (%d):\n",uVar5);
  for (lVar6 = 1; lVar6 < (p->pDesign->vNtks).nSize; lVar6 = lVar6 + 1) {
    p_00 = Cba_ManNtk(p->pDesign,(int)lVar6);
    if (pUserCounts[lVar6] != 0) {
      pcVar3 = Cba_NtkName(p_00);
      printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pUserCounts[lVar6]);
    }
  }
  return;
}

Assistant:

void Cba_NtkPrintDistribStat( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk; int i;
    printf( "Primitives (%d):\n", Cba_NtkBoxPrimNum(p) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(p, i), pCounts[i] );
    printf( "User hierarchy (%d):\n", Cba_NtkBoxUserNum(p) );
    Cba_ManForEachNtk( p->pDesign, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}